

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLenum gl4cts::CopyImage::Utils::getType(GLenum internal_format)

{
  TestError *this;
  GLenum type;
  GLenum internal_format_local;
  
  if (internal_format == 0x2a10) {
    return 0x8032;
  }
  if (internal_format - 0x804f < 2) {
    return 0x8363;
  }
  if (internal_format == 0x8051) {
    return 0x1401;
  }
  if (internal_format == 0x8052) {
    return 0x8368;
  }
  if (internal_format - 0x8053 < 2) {
    return 0x1403;
  }
  if (internal_format - 0x8055 < 2) {
    return 0x8033;
  }
  if (internal_format == 0x8057) {
    return 0x8034;
  }
  if (internal_format == 0x8058) {
    return 0x1401;
  }
  if (internal_format == 0x8059) {
    return 0x8368;
  }
  if (1 < internal_format - 0x805a) {
    if (internal_format == 0x8229) {
      return 0x1401;
    }
    if (internal_format != 0x822a) {
      if (internal_format == 0x822b) {
        return 0x1401;
      }
      if (internal_format != 0x822c) {
        if (internal_format == 0x822d) {
          return 0x140b;
        }
        if (internal_format != 0x822e) {
          if (internal_format == 0x822f) {
            return 0x140b;
          }
          if (internal_format != 0x8230) {
            if (internal_format == 0x8231) {
              return 0x1400;
            }
            if (internal_format == 0x8232) {
              return 0x1401;
            }
            if (internal_format == 0x8233) {
              return 0x1402;
            }
            if (internal_format == 0x8234) {
              return 0x1403;
            }
            if (internal_format == 0x8235) {
              return 0x1404;
            }
            if (internal_format == 0x8236) {
              return 0x1405;
            }
            if (internal_format == 0x8237) {
              return 0x1400;
            }
            if (internal_format == 0x8238) {
              return 0x1401;
            }
            if (internal_format == 0x8239) {
              return 0x1402;
            }
            if (internal_format == 0x823a) {
              return 0x1403;
            }
            if (internal_format == 0x823b) {
              return 0x1404;
            }
            if (internal_format != 0x823c) {
              if (internal_format - 0x8814 < 2) {
                return 0x1406;
              }
              if (internal_format - 0x881a < 2) {
                return 0x140b;
              }
              if (internal_format == 0x8c3a) {
                return 0x8c3b;
              }
              if (internal_format == 0x8c3d) {
                return 0x8c3e;
              }
              if (1 < internal_format - 0x8d70) {
                if (internal_format - 0x8d76 < 2) {
                  return 0x1403;
                }
                if (internal_format - 0x8d7c < 2) {
                  return 0x1401;
                }
                if (internal_format - 0x8d82 < 2) {
                  return 0x1404;
                }
                if (internal_format - 0x8d88 < 2) {
                  return 0x1402;
                }
                if (internal_format - 0x8d8e < 2) {
                  return 0x1400;
                }
                if (internal_format - 0x8f94 < 4) {
                  return 0x1400;
                }
                if (internal_format - 0x8f98 < 4) {
                  return 0x1402;
                }
                if (internal_format == 0x906f) {
                  return 0x8368;
                }
                this = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this,"Invalid enum",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                           ,0x421);
                __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
            }
            return 0x1405;
          }
        }
        return 0x1406;
      }
    }
  }
  return 0x1403;
}

Assistant:

GLenum Utils::getType(GLenum internal_format)
{
	GLenum type = 0;

	switch (internal_format)
	{
	case GL_R8:
	case GL_R8UI:
	case GL_RG8:
	case GL_RG8UI:
	case GL_RGB8:
	case GL_RGB8UI:
	case GL_RGBA8:
	case GL_RGBA8UI:
		type = GL_UNSIGNED_BYTE;
		break;

	case GL_R8_SNORM:
	case GL_R8I:
	case GL_RG8_SNORM:
	case GL_RG8I:
	case GL_RGB8_SNORM:
	case GL_RGB8I:
	case GL_RGBA8_SNORM:
	case GL_RGBA8I:
		type = GL_BYTE;
		break;

	case GL_R3_G3_B2:
		type = GL_UNSIGNED_BYTE_3_3_2;
		break;

	case GL_RGB4:
	case GL_RGB5:
		type = GL_UNSIGNED_SHORT_5_6_5;
		break;

	case GL_RGBA2:
	case GL_RGBA4:
		type = GL_UNSIGNED_SHORT_4_4_4_4;
		break;

	case GL_RGB5_A1:
		type = GL_UNSIGNED_SHORT_5_5_5_1;
		break;

	case GL_RGB10:
	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
		type = GL_UNSIGNED_INT_2_10_10_10_REV;
		break;

	case GL_R16F:
	case GL_RG16F:
	case GL_RGB16F:
	case GL_RGBA16F:
		type = GL_HALF_FLOAT;
		break;

	case GL_R16:
	case GL_R16UI:
	case GL_RG16:
	case GL_RG16UI:
	case GL_RGB12:
	case GL_RGB16:
	case GL_RGB16UI:
	case GL_RGBA12:
	case GL_RGBA16:
	case GL_RGBA16UI:
		type = GL_UNSIGNED_SHORT;
		break;

	case GL_R16_SNORM:
	case GL_R16I:
	case GL_RG16_SNORM:
	case GL_RG16I:
	case GL_RGB16_SNORM:
	case GL_RGB16I:
	case GL_RGBA16_SNORM:
	case GL_RGBA16I:
		type = GL_SHORT;
		break;

	case GL_R32UI:
	case GL_RG32UI:
	case GL_RGB32UI:
	case GL_RGBA32UI:
		type = GL_UNSIGNED_INT;
		break;

	case GL_RGB9_E5:
		type = GL_UNSIGNED_INT_5_9_9_9_REV;
		break;

	case GL_R32I:
	case GL_RG32I:
	case GL_RGB32I:
	case GL_RGBA32I:
		type = GL_INT;
		break;

	case GL_R32F:
	case GL_RG32F:
	case GL_RGB32F:
	case GL_RGBA32F:
		type = GL_FLOAT;
		break;

	case GL_R11F_G11F_B10F:
		type = GL_UNSIGNED_INT_10F_11F_11F_REV;
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return type;
}